

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O1

bool __thiscall
Kernel::InterpretedLiteralEvaluator::IntEvaluator::tryEvaluateBinaryPred
          (IntEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  switch(op) {
  case INT_GREATER:
    iVar2 = mpz_cmp(arg1->_val,arg2->_val);
    bVar1 = iVar2 == 1;
    break;
  case INT_GREATER_EQUAL:
    uVar3 = mpz_cmp(arg1->_val,arg2->_val);
    goto LAB_0054adb6;
  case INT_LESS:
    iVar2 = mpz_cmp(arg1->_val,arg2->_val);
    bVar1 = iVar2 == -1;
    break;
  case INT_LESS_EQUAL:
    iVar2 = mpz_cmp(arg1->_val,arg2->_val);
    uVar3 = iVar2 + 1;
LAB_0054adb6:
    bVar1 = uVar3 < 2;
    break;
  case INT_DIVIDES:
    bVar1 = IntegerConstantType::divides(arg1,arg2);
    break;
  default:
    return false;
  }
  *res = bVar1;
  return true;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::INT_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::INT_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::INT_LESS:
      res = arg1<arg2;
      return true;
    case Theory::INT_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    case Theory::INT_DIVIDES:
      res = arg1.divides(arg2);
      return true;
    default:
      return false;
    }
  }